

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

Frame * __thiscall rw::Frame::cloneAndLink(Frame *this)

{
  uint8 *puVar1;
  LLLink *pLVar2;
  byte bVar3;
  Frame *pFVar4;
  LLLink *pLVar5;
  long lVar6;
  Frame *pFVar7;
  
  pFVar7 = cloneRecurse(this,(Frame *)0x0);
  if (pFVar7 != (Frame *)0x0) {
    puVar1 = &(pFVar7->object).privateFlags;
    *puVar1 = *puVar1 & 0xfc;
    lVar6 = engine;
    pFVar4 = pFVar7->root;
    bVar3 = (pFVar4->object).privateFlags;
    if ((bVar3 & 3) == 0) {
      pLVar2 = (LLLink *)(engine + 0x10);
      pLVar5 = *(LLLink **)(engine + 0x10);
      (pFVar4->inDirtyList).next = pLVar5;
      (pFVar4->inDirtyList).prev = pLVar2;
      pLVar5->prev = &pFVar4->inDirtyList;
      *(LLLink **)(lVar6 + 0x10) = &pFVar4->inDirtyList;
    }
    (pFVar4->object).privateFlags = bVar3 | 3;
    puVar1 = &(pFVar7->object).privateFlags;
    *puVar1 = *puVar1 | 0xc;
  }
  return pFVar7;
}

Assistant:

Frame*
Frame::cloneAndLink(void)
{
	Frame *newhier = cloneRecurse(this, nil);
	if(newhier){
		// frame is not in dirty list so important to get this flag right
		newhier->object.privateFlags &= ~HIERARCHYSYNC;
		newhier->updateObjects();
	}
	return newhier;
}